

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O2

int gz_load(gz_state *state,uchar *buf,uint len,uint *have)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  char *msg;
  
  *have = 0;
  uVar1 = 0;
  do {
    sVar2 = read(state->fd,buf + uVar1,(ulong)(len - uVar1));
    if (sVar2 < 1) {
      if (-1 < sVar2) {
        state->eof = 1;
        return 0;
      }
      piVar3 = __errno_location();
      msg = strerror(*piVar3);
      gz_error(state,-1,msg);
      return -1;
    }
    uVar1 = (int)sVar2 + *have;
    *have = uVar1;
  } while (uVar1 < len);
  return 0;
}

Assistant:

static int gz_load(gz_state *state, unsigned char *buf, unsigned len, unsigned *have) {
    ssize_t ret;

    *have = 0;
    do {
        ret = read(state->fd, buf + *have, len - *have);
        if (ret <= 0)
            break;
        *have += (unsigned)ret;
    } while (*have < len);
    if (ret < 0) {
        gz_error(state, Z_ERRNO, zstrerror());
        return -1;
    }
    if (ret == 0)
        state->eof = 1;
    return 0;
}